

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

string * ReplaceLine(string *__return_storage_ptr__,string *s,int line_index,StringRef new_line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  long lVar4;
  size_type sVar5;
  Error *this;
  int iVar6;
  ulong uVar7;
  
  if (line_index < 1) {
    uVar7 = 0;
  }
  else {
    iVar6 = line_index + 1;
    do {
      lVar4 = std::__cxx11::string::find((char)s,10);
      if (lVar4 == -1) {
        this = (Error *)__cxa_allocate_exception(0x18);
        mp::Error::Error(this,(CStringRef)0x22a7ae,-1);
        __cxa_throw(this,&mp::Error::typeinfo,fmt::SystemError::~SystemError);
      }
      uVar7 = lVar4 + 1;
      iVar6 = iVar6 + -1;
    } while (1 < iVar6);
  }
  sVar5 = std::__cxx11::string::find((char)s,10);
  if (sVar5 == 0xffffffffffffffff) {
    sVar5 = s->_M_string_length;
  }
  std::__cxx11::string::replace((ulong)s,uVar7,(char *)(sVar5 - uVar7),(ulong)new_line.data_);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (s->_M_dataplus)._M_p;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&s->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string ReplaceLine(std::string s, int line_index,
                        fmt::StringRef new_line) {
  std::string::size_type start = 0;
  while (line_index-- > 0) {
    start = s.find('\n', start);
    if (start == std::string::npos)
      throw mp::Error("invalid line index");
    ++start;
  }
  std::string::size_type end = s.find('\n', start);
  if (end == std::string::npos)
    end = s.size();
  s.replace(start, end - start, new_line.data(), new_line.size());
  return s;
}